

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,string *name,PlaceholderType placeholder_type)

{
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *psVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  Tables *pTVar7;
  string *psVar8;
  long lVar9;
  FileDescriptor *pFVar10;
  anon_union_8_8_13f84498_for_Symbol_2 aVar11;
  EnumOptions *pEVar12;
  undefined8 *puVar13;
  string *psVar14;
  MessageOptions *pMVar15;
  EnumValueOptions *pEVar16;
  size_type sVar17;
  undefined8 uVar18;
  Symbol SVar19;
  allocator local_69;
  string local_68;
  string *local_48;
  string *local_40;
  scoped_ptr<google::protobuf::DescriptorPool::Tables> *local_38;
  
  if (this->mutex_ != (Mutex *)0x0) {
    internal::Mutex::AssertHeld(this->mutex_);
  }
  pcVar4 = (name->_M_dataplus)._M_p;
  sVar17 = 0;
  bVar5 = false;
  do {
    if (name->_M_string_length == sVar17) {
      if (name->_M_string_length == 0 || bVar5) {
LAB_005bd5e4:
        aVar11.descriptor = (Descriptor *)0x0;
        uVar18 = 0;
      }
      else {
        cVar3 = *pcVar4;
        psVar1 = &this->tables_;
        pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->(psVar1);
        if (cVar3 == '.') {
          std::__cxx11::string::substr((ulong)&local_68,(ulong)name);
          psVar8 = Tables::AllocateString(pTVar7,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
        else {
          psVar8 = Tables::AllocateString(pTVar7,name);
        }
        lVar9 = std::__cxx11::string::rfind((char)psVar8,0x2e);
        local_38 = psVar1;
        if (lVar9 == -1) {
          local_40 = internal::GetEmptyString_abi_cxx11_();
          local_48 = psVar8;
        }
        else {
          pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (psVar1);
          std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar8);
          local_40 = Tables::AllocateString(pTVar7,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (psVar1);
          std::__cxx11::string::substr((ulong)&local_68,(ulong)psVar8);
          local_48 = Tables::AllocateString(pTVar7,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
        std::operator+(&local_68,psVar8,".placeholder.proto");
        pFVar10 = NewPlaceholderFileWithMutexHeld(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        psVar1 = local_38;
        *(string **)(pFVar10 + 8) = local_40;
        if (placeholder_type == PLACEHOLDER_ENUM) {
          *(undefined4 *)(pFVar10 + 0x68) = 1;
          pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (local_38);
          aVar11.descriptor = (Descriptor *)Tables::AllocateBytes(pTVar7,0x38);
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(pFVar10 + 0x70))->descriptor =
               (Descriptor *)aVar11;
          *(undefined8 *)(aVar11.descriptor + 0x18) = 0;
          *(undefined8 *)(aVar11.descriptor + 0x20) = 0;
          *(undefined8 *)(aVar11.descriptor + 0x28) = 0;
          *(undefined8 *)(aVar11.descriptor + 0x30) = 0;
          *(string **)(aVar11.descriptor + 8) = psVar8;
          *(string **)aVar11.descriptor = local_48;
          *(FileDescriptor **)(aVar11.descriptor + 0x10) = pFVar10;
          pEVar12 = EnumOptions::default_instance();
          *(EnumOptions **)(aVar11.descriptor + 0x20) = pEVar12;
          aVar11.descriptor[0x28] = (Descriptor)0x1;
          aVar11.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
          *(undefined4 *)(aVar11.descriptor + 0x2c) = 1;
          pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (psVar1);
          puVar13 = (undefined8 *)Tables::AllocateBytes(pTVar7,0x28);
          *(undefined8 **)(aVar11.descriptor + 0x30) = puVar13;
          *puVar13 = 0;
          puVar13[1] = 0;
          puVar13[2] = 0;
          puVar13[3] = 0;
          puVar13[4] = 0;
          pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (psVar1);
          std::__cxx11::string::string((string *)&local_68,"PLACEHOLDER_VALUE",&local_69);
          psVar14 = Tables::AllocateString(pTVar7,&local_68);
          psVar8 = local_40;
          *puVar13 = psVar14;
          std::__cxx11::string::~string((string *)&local_68);
          if (psVar8->_M_string_length == 0) {
            puVar13[1] = *puVar13;
          }
          else {
            pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                               (psVar1);
            std::operator+(&local_68,psVar8,".PLACEHOLDER_VALUE");
            psVar8 = Tables::AllocateString(pTVar7,&local_68);
            puVar13[1] = psVar8;
            std::__cxx11::string::~string((string *)&local_68);
          }
          *(undefined4 *)(puVar13 + 2) = 0;
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(puVar13 + 3))->descriptor = (Descriptor *)aVar11
          ;
          pEVar16 = EnumValueOptions::default_instance();
          puVar13[4] = pEVar16;
          uVar18 = 4;
        }
        else {
          *(undefined4 *)(pFVar10 + 0x58) = 1;
          pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                             (local_38);
          aVar11.descriptor = (Descriptor *)Tables::AllocateBytes(pTVar7,0xa8);
          ((anon_union_8_8_13f84498_for_Symbol_2 *)(pFVar10 + 0x60))->descriptor =
               (Descriptor *)aVar11;
          memset(aVar11.descriptor + 0x18,0,0x90);
          *(string **)(aVar11.descriptor + 8) = psVar8;
          *(string **)aVar11.descriptor = local_48;
          *(FileDescriptor **)(aVar11.descriptor + 0x10) = pFVar10;
          pMVar15 = MessageOptions::default_instance();
          *(MessageOptions **)(aVar11.descriptor + 0x20) = pMVar15;
          aVar11.descriptor[0x28] = (Descriptor)0x1;
          aVar11.descriptor[0x29] = (Descriptor)(*(name->_M_dataplus)._M_p != '.');
          uVar18 = 1;
          if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
            *(undefined4 *)(aVar11.descriptor + 0x68) = 1;
            pTVar7 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                               (psVar1);
            puVar13 = (undefined8 *)Tables::AllocateBytes(pTVar7,8);
            *(undefined8 **)(aVar11.descriptor + 0x70) = puVar13;
            *puVar13 = 0x2000000000000001;
          }
        }
      }
LAB_005bd904:
      SVar19.field_1.descriptor = aVar11.descriptor;
      SVar19._0_8_ = uVar18;
      return SVar19;
    }
    bVar2 = pcVar4[sVar17];
    if ((char)bVar2 < 'a') {
      if ((char)bVar2 < 'A') {
        if ((char)bVar2 < '0') {
          if ((bVar2 != 0x2e) || (bVar6 = true, bVar5)) goto LAB_005bd5e4;
        }
        else {
          bVar6 = false;
          if (0x39 < bVar2) goto LAB_005bd5ef;
        }
      }
      else {
        bVar6 = false;
        if (bVar2 != 0x5f && 0x5a < bVar2) goto LAB_005bd5ef;
      }
    }
    else {
      bVar6 = false;
      if (0x7a < bVar2) {
LAB_005bd5ef:
        uVar18 = 0;
        aVar11.descriptor = (Descriptor *)0x0;
        goto LAB_005bd904;
      }
    }
    bVar5 = bVar6;
    sVar17 = sVar17 + 1;
  } while( true );
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    const string& name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  const string* placeholder_full_name;
  const string* placeholder_name;
  const string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = tables_->AllocateString(name.substr(1));
  } else {
    placeholder_full_name = tables_->AllocateString(name);
  }

  string::size_type dotpos = placeholder_full_name->find_last_of('.');
  if (dotpos != string::npos) {
    placeholder_package = tables_->AllocateString(
      placeholder_full_name->substr(0, dotpos));
    placeholder_name = tables_->AllocateString(
      placeholder_full_name->substr(dotpos + 1));
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      *placeholder_full_name + ".placeholder.proto");
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ =
      tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(placeholder_enum, 0, sizeof(*placeholder_enum));

    placeholder_enum->full_name_ = placeholder_full_name;
    placeholder_enum->name_ = placeholder_name;
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(placeholder_value, 0, sizeof(*placeholder_value));

    placeholder_value->name_ = tables_->AllocateString("PLACEHOLDER_VALUE");
    // Note that enum value names are siblings of their type, not children.
    placeholder_value->full_name_ =
      placeholder_package->empty() ? placeholder_value->name_ :
        tables_->AllocateString(*placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ =
      tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(placeholder_message, 0, sizeof(*placeholder_message));

    placeholder_message->full_name_ = placeholder_full_name;
    placeholder_message->name_ = placeholder_name;
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
        tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
        FieldDescriptor::kMaxNumber + 1;
    }

    return Symbol(placeholder_message);
  }
}